

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O0

void __thiscall
sglr::GLContext::genVertexArrays(GLContext *this,int numArrays,deUint32 *vertexArrays)

{
  deUint32 *vertexArrays_local;
  int numArrays_local;
  GLContext *this_local;
  
  glu::CallLogWrapper::glGenVertexArrays(this->m_wrapper,numArrays,vertexArrays);
  if (0 < numArrays) {
    std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
    insert<unsigned_int*>
              ((set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)
               &this->m_allocatedVaos,vertexArrays,vertexArrays + numArrays);
  }
  return;
}

Assistant:

void GLContext::genVertexArrays (int numArrays, deUint32* vertexArrays)
{
	m_wrapper->glGenVertexArrays(numArrays, vertexArrays);
	if (numArrays > 0)
		m_allocatedVaos.insert(vertexArrays, vertexArrays+numArrays);
}